

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  pointer *this_00;
  char *__s;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppcVar3;
  string *psVar4;
  allocator<char> local_1c1;
  value_type local_1c0;
  allocator<char> local_199;
  value_type local_198;
  undefined1 local_178 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  const_iterator local_78;
  char **target;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  undefined1 local_48 [8];
  string configFile;
  cmMakefile *mf;
  char *packageSourceTargetName;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x1e])();
  if ((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) {
    ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,0);
    configFile.field_2._8_8_ = *ppcVar3;
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmMakefile *)configFile.field_2._8_8_);
    std::__cxx11::string::string((string *)local_48,(string *)psVar4);
    std::__cxx11::string::operator+=((string *)local_48,"/CPackSourceConfig.cmake");
    bVar1 = cmsys::SystemTools::FileExists((string *)local_48);
    if (bVar1) {
      __begin1 = (const_iterator)&AddGlobalTarget_PackageSource::reservedTargets;
      __end1 = std::initializer_list<const_char_*>::begin
                         (&AddGlobalTarget_PackageSource::reservedTargets);
      target = std::initializer_list<const_char_*>::end
                         (&AddGlobalTarget_PackageSource::reservedTargets);
      for (; __end1 != target; __end1 = __end1 + 1) {
        local_78 = __end1;
        __s = *__end1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"when CPack source packaging is enabled",
                   (allocator<char> *)&gti.field_0x97);
        bVar1 = CheckCMP0037(this,&local_98,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&gti.field_0x97);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          __range1._0_4_ = 1;
          goto LAB_0027a989;
        }
      }
      this_00 = &singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)this_00);
      std::__cxx11::string::operator=((string *)this_00,(char *)CONCAT44(extraout_var,iVar2));
      std::__cxx11::string::operator=
                ((string *)(gti.Name.field_2._M_local_buf + 8),
                 "Run CPack packaging tool for source...");
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                         ((cmMakefile *)configFile.field_2._8_8_);
      std::__cxx11::string::operator=
                ((string *)
                 &gti.Depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar4);
      gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
      cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_178);
      psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178,psVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"--config",&local_199)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"./CPackSourceConfig.cmake",&local_1c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_178,(value_type *)local_48);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 ((long)&gti.Message.field_2 + 8),(value_type *)local_178);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(targets,(value_type *)
                          &singleLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_178);
      GlobalTargetInfo::~GlobalTargetInfo
                ((GlobalTargetInfo *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __range1._0_4_ = 0;
    }
    else {
      __range1._0_4_ = 1;
    }
LAB_0027a989:
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (!packageSourceTargetName) {
    return;
  }

  cmMakefile* mf = this->Makefiles[0];
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackSourceConfig.cmake";
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package_source" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target,
                            "when CPack source packaging is enabled")) {
      return;
    }
  }

  GlobalTargetInfo gti;
  gti.Name = packageSourceTargetName;
  gti.Message = "Run CPack packaging tool for source...";
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  singleLine.push_back("--config");
  singleLine.push_back("./CPackSourceConfig.cmake");
  singleLine.push_back(std::move(configFile));
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}